

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

size_t jessilib::make_map_start_action<char16_t,jessilib::json_context<char16_t,true>>
                 (json_context<char16_t,_true> *inout_context,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> *inout_read_view)

{
  bool bVar1;
  size_t sVar2;
  mapped_type *out_object;
  invalid_argument *piVar3;
  int iVar4;
  int iVar5;
  char16_t *pcVar6;
  size_t unaff_RBP;
  undefined1 auVar7 [16];
  decode_result dVar8;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  KeyContext<true> key_context;
  map_type result;
  key_type local_f8;
  anon_class_8_1_8991fb9c local_d8;
  char8_t *local_d0;
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_c8;
  char32_t local_80 [2];
  char8_t *local_78;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_70;
  _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sVar2 = inout_read_view->_M_len;
  if (sVar2 != 0) {
    pcVar6 = inout_read_view->_M_str;
    do {
      sVar2 = sVar2 - 1;
      if ((0x20 < (ulong)(ushort)*pcVar6) ||
         ((0x100002600U >> ((ulong)(ushort)*pcVar6 & 0x3f) & 1) == 0)) break;
      inout_read_view->_M_str = pcVar6 + 1;
      inout_read_view->_M_len = sVar2;
      pcVar6 = pcVar6 + 1;
    } while (sVar2 != 0);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    sVar2 = inout_read_view->_M_len;
    if (sVar2 == 0) goto LAB_001fd6a4;
    pcVar6 = inout_read_view->_M_str;
    if (*pcVar6 == L'\"') {
      inout_read_view->_M_str = pcVar6 + 1;
      inout_read_view->_M_len = sVar2 - 1;
      sVar2 = string_start_action<char16_t,jessilib::KeyContext<true>>
                        ((KeyContext<true> *)&local_f8,inout_read_view);
      if (sVar2 != 1) {
        unaff_RBP = 0xffffffffffffffff;
        goto LAB_001fd655;
      }
      sVar2 = inout_read_view->_M_len;
      if (sVar2 != 0) {
        pcVar6 = inout_read_view->_M_str;
        do {
          sVar2 = sVar2 - 1;
          if ((0x20 < (ulong)(ushort)*pcVar6) ||
             ((0x100002600U >> ((ulong)(ushort)*pcVar6 & 0x3f) & 1) == 0)) break;
          inout_read_view->_M_str = pcVar6 + 1;
          inout_read_view->_M_len = sVar2;
          pcVar6 = pcVar6 + 1;
        } while (sVar2 != 0);
      }
      out_object = std::
                   map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                                 *)&local_60,&local_f8);
      if (inout_read_view->_M_len == 0) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar3,
                   "Invalid JSON data; unexpected end of data after parsing map key; expected \':\' followed by value"
                  );
LAB_001fd836:
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if (*inout_read_view->_M_str != L':') {
        auVar7 = __cxa_allocate_exception(0x10);
        in_string_00._M_str = auVar7._8_8_;
        local_d8.this =
             (_Move_assign_base<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
              *)0x26;
        local_d0 = "Invalid JSON data; unexpected token: \'";
        in_string_00._M_len = (size_t)inout_read_view->_M_str;
        dVar8 = decode_codepoint<char16_t>((jessilib *)inout_read_view->_M_len,in_string_00);
        local_70._M_str = (char8_t *)dVar8.units;
        local_70._M_len._0_4_ = dVar8.codepoint;
        local_80[0] = L'-';
        local_80[1] = L'\0';
        local_78 = "\' when parsing map key (expected \':\' instead)";
        join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                  ((string *)&local_c8,(jessilib *)&local_d8,&local_70,local_80,&local_70);
        std::invalid_argument::invalid_argument(auVar7._0_8_,(string *)&local_c8);
        __cxa_throw(auVar7._0_8_,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      inout_read_view->_M_str = inout_read_view->_M_str + 1;
      inout_read_view->_M_len = inout_read_view->_M_len - 1;
      bVar1 = deserialize_json<char16_t,_true,_&jessilib::fail_action>(out_object,inout_read_view);
      iVar5 = 3;
      if (bVar1) {
        sVar2 = inout_read_view->_M_len;
        if (sVar2 != 0) {
          pcVar6 = inout_read_view->_M_str;
          do {
            sVar2 = sVar2 - 1;
            if ((0x20 < (ulong)(ushort)*pcVar6) ||
               ((0x100002600U >> ((ulong)(ushort)*pcVar6 & 0x3f) & 1) == 0)) break;
            inout_read_view->_M_str = pcVar6 + 1;
            inout_read_view->_M_len = sVar2;
            pcVar6 = pcVar6 + 1;
          } while (sVar2 != 0);
        }
        sVar2 = inout_read_view->_M_len;
        if (sVar2 == 0) {
          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar3,
                     "Invalid JSON data; unexpected end of data after parsing map value; expected \'}\'"
                    );
          goto LAB_001fd836;
        }
        pcVar6 = inout_read_view->_M_str;
        iVar4 = 0;
        iVar5 = iVar4;
        if (*pcVar6 == L',') {
          inout_read_view->_M_str = pcVar6 + 1;
          inout_read_view->_M_len = sVar2 - 1;
          if (sVar2 - 1 != 0) {
            pcVar6 = pcVar6 + 2;
            sVar2 = sVar2 - 2;
            do {
              iVar5 = iVar4;
              if ((0x20 < (ulong)(ushort)pcVar6[-1]) ||
                 (iVar5 = 0, (0x100002600U >> ((ulong)(ushort)pcVar6[-1] & 0x3f) & 1) == 0)) break;
              inout_read_view->_M_str = pcVar6;
              inout_read_view->_M_len = sVar2;
              pcVar6 = pcVar6 + 1;
              bVar1 = sVar2 != 0;
              sVar2 = sVar2 - 1;
            } while (bVar1);
          }
        }
      }
    }
    else {
      if (*pcVar6 != L'}') {
        auVar7 = __cxa_allocate_exception(0x10);
        in_string._M_str = auVar7._8_8_;
        local_d8.this =
             (_Move_assign_base<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
              *)0x26;
        local_d0 = "Invalid JSON data; unexpected token: \'";
        in_string._M_len = (size_t)inout_read_view->_M_str;
        dVar8 = decode_codepoint<char16_t>((jessilib *)inout_read_view->_M_len,in_string);
        local_70._M_str = (char8_t *)dVar8.units;
        local_70._M_len._0_4_ = dVar8.codepoint;
        local_80[0] = L'0';
        local_80[1] = L'\0';
        local_78 = "\' when parsing object map (expected \'\"\' instead)";
        join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char32_t,std::basic_string_view<char8_t,std::char_traits<char8_t>>>
                  ((string *)&local_c8,(jessilib *)&local_d8,&local_70,local_80,&local_70);
        std::invalid_argument::invalid_argument(auVar7._0_8_,(string *)&local_c8);
        __cxa_throw(auVar7._0_8_,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      inout_read_view->_M_str = pcVar6 + 1;
      inout_read_view->_M_len = sVar2 - 1;
      object::
      object<std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>,_nullptr>
                ((object *)&local_c8,
                 (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                  *)&local_60);
      local_d8.this =
           (_Move_assign_base<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
            *)inout_context->out_object;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>_&>
        ::_S_vtable._M_arr[(long)(char)local_c8._M_index + 1]._M_data)
                (&local_d8,
                 (variant<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                  *)&local_c8);
      std::__detail::__variant::
      _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      ::~_Variant_storage(&local_c8);
      unaff_RBP = 1;
LAB_001fd655:
      iVar5 = 1;
    }
  } while (iVar5 == 0);
  if (iVar5 != 3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
    ::~_Rb_tree(&local_60);
    return unaff_RBP;
  }
LAB_001fd6a4:
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar3,
             "Invalid JSON data: unexpected end of data when parsing object array; expected \'}\'");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t make_map_start_action(ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) {
	using namespace std::literals;
	object::map_type result;

	advance_whitespace(inout_read_view);
	KeyContext<ContextT::use_exceptions> key_context;
	while (!inout_read_view.empty()) {
		// inout_read_view now points to either the start of a key, the end of the object, or invalid data
		CharT front = inout_read_view.front();
		if (front == '}') {
			// End of object
			inout_read_view.remove_prefix(1);
			inout_context.out_object = object{ std::move(result) }; // TODO: fix move semantics here
			return 1;
		}

		// Assert that we've reached the start of a key
		if (front != '\"') {
			if constexpr (ContextT::use_exceptions) {
				throw std::invalid_argument{
					jessilib::join_mbstring(u8"Invalid JSON data; unexpected token: '"sv,
					decode_codepoint(inout_read_view).codepoint,
					u8"' when parsing object map (expected '\"' instead)"sv) };
			}

			return std::numeric_limits<size_t>::max();
		}

		// Read in key
		inout_read_view.remove_prefix(1); // front quote
		// TODO: really should be using the escape sequencing method instead of this
		if (string_start_action<CharT, decltype(key_context)>(key_context, inout_read_view) != 1) {
			// Failed to find end of string; any exception would've been thrown in string_start_action
			return std::numeric_limits<size_t>::max();
		}
		advance_whitespace(inout_read_view);

		// Insert our value object
		auto& value = result[key_context.out_object];

		// Verify next character is ':'
		if (inout_read_view.empty()) {
			throw std::invalid_argument{
				"Invalid JSON data; unexpected end of data after parsing map key; expected ':' followed by value" };
		}
		front = inout_read_view.front();
		if (front != ':') {
			throw std::invalid_argument{
				jessilib::join_mbstring(u8"Invalid JSON data; unexpected token: '"sv,
				decode_codepoint(inout_read_view).codepoint,
				u8"' when parsing map key (expected ':' instead)"sv) };
		}
		inout_read_view.remove_prefix(1); // strip ':'

		// We've reached an object value; parse it
		if (!deserialize_json<CharT, ContextT::use_exceptions>(value, inout_read_view)) {
			// Invalid JSON! Any exception would've been thrown already
			break;
		}

		// Advance through whitespace to ',' or '}'
		advance_whitespace(inout_read_view);

		if (inout_read_view.empty()) {
			throw std::invalid_argument{
				"Invalid JSON data; unexpected end of data after parsing map value; expected '}'" };
		}

		if (inout_read_view.front() == ',') {
			// Strip comma and trailing whitespace
			inout_read_view.remove_prefix(1);
			advance_whitespace(inout_read_view);
		}
	}

	if constexpr (ContextT::use_exceptions) {
		throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected '}'" };
	}

	return std::numeric_limits<size_t>::max();
}